

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

int mock_loader_impl_initialize_types(loader_impl impl)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 in_RDI;
  type t;
  size_t size;
  size_t index;
  ulong local_18;
  
  local_18 = 0;
  do {
    if (9 < local_18) {
      return 0;
    }
    lVar2 = type_create(mock_loader_impl_initialize_types::type_id_name_pair[local_18].id,
                        mock_loader_impl_initialize_types::type_id_name_pair[local_18].name,0);
    if (lVar2 != 0) {
      uVar3 = type_name(lVar2);
      iVar1 = loader_impl_type_define(in_RDI,uVar3,lVar2);
      if (iVar1 != 0) {
        type_destroy(lVar2);
        return 1;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int mock_loader_impl_initialize_types(loader_impl impl)
{
	/* TODO: move this to loader_impl by passing the structure and loader_impl_derived callback */

	static struct
	{
		type_id id;
		const char *name;
	} type_id_name_pair[] = {
		{ TYPE_BOOL, "Boolean" },
		{ TYPE_CHAR, "Char" },
		{ TYPE_SHORT, "Short" },
		{ TYPE_INT, "Integer" },
		{ TYPE_LONG, "Long" },
		{ TYPE_FLOAT, "Float" },
		{ TYPE_DOUBLE, "Double" },
		{ TYPE_STRING, "String" },
		{ TYPE_BUFFER, "Buffer" },
		{ TYPE_PTR, "Ptr" }
	};

	size_t index, size = sizeof(type_id_name_pair) / sizeof(type_id_name_pair[0]);

	for (index = 0; index < size; ++index)
	{
		type t = type_create(type_id_name_pair[index].id, type_id_name_pair[index].name, NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(impl, type_name(t), t) != 0)
			{
				type_destroy(t);
				return 1;
			}
		}
	}

	return 0;
}